

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

void __thiscall cmsys::Glob::AddExpression(Glob *this,string *expr)

{
  GlobInternals *pGVar1;
  string local_100;
  RegularExpression local_e0;
  
  pGVar1 = this->Internals;
  PatternToRegex(&local_100,expr,true,false);
  RegularExpression::RegularExpression(&local_e0,&local_100);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
  emplace_back<cmsys::RegularExpression>(&pGVar1->Expressions,&local_e0);
  RegularExpression::~RegularExpression(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  return;
}

Assistant:

void Glob::AddExpression(const std::string& expr)
{
  this->Internals->Expressions.push_back(
    kwsys::RegularExpression(
      this->PatternToRegex(expr)));
}